

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int lyp_check_import(lys_module *module,char *value,lys_import *imp)

{
  int iVar1;
  lys_module *plVar2;
  LY_ERR *pLVar3;
  char *local_50;
  lys_module *local_38;
  lys_module *dup;
  int i;
  lys_import *imp_local;
  char *value_local;
  lys_module *module_local;
  
  local_38 = (lys_module *)0x0;
  dup._4_4_ = 0;
  do {
    if ((int)(uint)module->imp_size <= dup._4_4_) {
LAB_00133fa8:
      iVar1 = lyp_check_circmod(module,value,1);
      if (iVar1 == 0) {
        if (imp->rev[0] == '\0') {
          local_50 = (char *)0x0;
        }
        else {
          local_50 = imp->rev;
        }
        plVar2 = ly_ctx_load_sub_module
                           (module->ctx,(lys_module *)0x0,value,local_50,
                            (uint)(((module->ctx->models).flags & 1) != 0),(unres_schema *)0x0);
        imp->module = plVar2;
        if (imp->module == (lys_module *)0x0) {
          pLVar3 = ly_errno_location();
          *pLVar3 = LY_EVALID;
          ly_log(LY_LLERR,"Importing \"%s\" module into \"%s\" failed.",value,module->name);
          module_local._4_4_ = -1;
        }
        else if ((local_38 == (lys_module *)0x0) ||
                (((local_38 == imp->module &&
                  ((local_38->rev_size == imp->module->rev_size ||
                   ((local_38->rev_size != '\0' && (imp->module->rev_size == '\0')))))) &&
                 ((local_38->rev_size == '\0' ||
                  (iVar1 = strcmp(local_38->rev->date,imp->module->rev->date), iVar1 == 0)))))) {
          module_local._4_4_ = 0;
        }
        else {
          ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,value,"import");
          ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Importing multiple revisions of module \"%s\"."
                  ,value);
          module_local._4_4_ = -1;
        }
      }
      else {
        module_local._4_4_ = -1;
      }
      return module_local._4_4_;
    }
    if ((module->imp[dup._4_4_].module != (lys_module *)0x0) &&
       ((module->imp[dup._4_4_].module)->name == value)) {
      if ((imp->rev[0] != '\0') &&
         (((module->imp[dup._4_4_].module)->rev_size == '\0' ||
          (iVar1 = strcmp((module->imp[dup._4_4_].module)->rev->date,imp->rev), iVar1 != 0)))) {
        ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,value,"import");
        ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Importing multiple revisions of module \"%s\".",
                value);
        return -1;
      }
      if (imp->rev[0] != '\0') {
        imp->module = module->imp[dup._4_4_].module;
        return 0;
      }
      local_38 = module->imp[dup._4_4_].module;
      goto LAB_00133fa8;
    }
    dup._4_4_ = dup._4_4_ + 1;
  } while( true );
}

Assistant:

int
lyp_check_import(struct lys_module *module, const char *value, struct lys_import *imp)
{
    int i;
    struct lys_module *dup = NULL;

    /* check for importing a single module in multiple revisions */
    for (i = 0; i < module->imp_size; i++) {
        if (!module->imp[i].module) {
            /* skip the not yet filled records */
            continue;
        }
        if (ly_strequal(module->imp[i].module->name, value, 1)) {
            /* check revisions, including multiple revisions of a single module is error */
            if (imp->rev[0] && (!module->imp[i].module->rev_size || strcmp(module->imp[i].module->rev[0].date, imp->rev))) {
                /* the already imported module has
                 * - no revision, but here we require some
                 * - different revision than the one required here */
                LOGVAL(LYE_INARG, LY_VLOG_NONE, NULL, value, "import");
                LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Importing multiple revisions of module \"%s\".", value);
                return -1;
            } else if (!imp->rev[0]) {
                /* no revision, remember the duplication, but check revisions after loading the module
                 * because the current revision can be the same (then it is ok) or it can differ (then it
                 * is error */
                dup = module->imp[i].module;
                break;
            }

            /* there is duplication, but since prefixes differs (checked in caller of this function),
             * it is ok */
            imp->module = module->imp[i].module;
            return 0;
        }
    }

    /* circular import check */
    if (lyp_check_circmod(module, value, 1)) {
        return -1;
    }

    /* load module - in specific situations it tries to get the module from the context */
    imp->module = (struct lys_module *)ly_ctx_load_sub_module(module->ctx, NULL, value, imp->rev[0] ? imp->rev : NULL,
                                                              module->ctx->models.flags & LY_CTX_ALLIMPLEMENTED ? 1 : 0,
                                                              NULL);

    /* check the result */
    if (!imp->module) {
        LOGERR(LY_EVALID, "Importing \"%s\" module into \"%s\" failed.", value, module->name);
        return -1;
    }

    if (dup) {
        /* check the revisions */
        if ((dup != imp->module) ||
                (dup->rev_size != imp->module->rev_size && (!dup->rev_size || imp->module->rev_size)) ||
                (dup->rev_size && strcmp(dup->rev[0].date, imp->module->rev[0].date))) {
            /* - modules are not the same
             * - one of modules has no revision (except they both has no revision)
             * - revisions of the modules are not the same */
            LOGVAL(LYE_INARG, LY_VLOG_NONE, NULL, value, "import");
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Importing multiple revisions of module \"%s\".", value);
            return -1;
        }
    }

    return 0;
}